

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

float ImGui::ScaleRatioFromValueT<int,int,float>
                (ImGuiDataType data_type,int v,int v_min,int v_max,bool is_logarithmic,
                float logarithmic_zero_epsilon,float zero_deadzone_halfsize)

{
  undefined8 uVar1;
  bool bVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  int iVar8;
  int iVar9;
  int iVar10;
  bool bVar11;
  float fVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  float fVar16;
  float fVar17;
  undefined1 in_register_00001204 [60];
  undefined1 auVar18 [64];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 in_ZMM2 [64];
  undefined1 auVar21 [16];
  int iVar22;
  undefined1 in_register_00001404 [12];
  
  auVar18._4_60_ = in_register_00001204;
  auVar18._0_4_ = logarithmic_zero_epsilon;
  auVar15 = auVar18._0_16_;
  fVar12 = 0.0;
  iVar9 = v_max - v_min;
  if (iVar9 != 0) {
    iVar8 = v_max;
    if (v_max < v_min) {
      iVar8 = v_min;
    }
    iVar10 = v_max;
    if (iVar9 != 0 && v_min <= v_max) {
      iVar10 = v_min;
    }
    if (v < iVar8) {
      iVar8 = v;
    }
    if (v < iVar10) {
      iVar8 = iVar10;
    }
    auVar20._4_12_ = in_ZMM2._4_12_;
    if (is_logarithmic) {
      auVar14._8_4_ = 0x80000000;
      auVar14._0_8_ = 0x8000000080000000;
      auVar14._12_4_ = 0x80000000;
      auVar13 = vxorps_avx512vl(auVar15,auVar14);
      iVar9 = v_min;
      if (v_max < v_min) {
        iVar9 = v_max;
      }
      iVar10 = v_min;
      if (v_min < v_max) {
        iVar10 = v_max;
      }
      auVar21._0_4_ = (float)iVar10;
      auVar21._4_12_ = auVar20._4_12_;
      auVar20._0_4_ = (float)iVar9;
      auVar3._8_4_ = 0x7fffffff;
      auVar3._0_8_ = 0x7fffffff7fffffff;
      auVar3._12_4_ = 0x7fffffff;
      auVar14 = vandps_avx512vl(auVar21,auVar3);
      bVar11 = iVar10 < 0;
      iVar22 = auVar13._0_4_;
      uVar1 = vcmpss_avx512f(auVar14,auVar15,1);
      bVar2 = (bool)((byte)uVar1 & 1);
      fVar12 = (float)((uint)bVar2 *
                       ((uint)bVar11 * iVar22 + (uint)!bVar11 * (int)logarithmic_zero_epsilon) +
                      (uint)!bVar2 * (int)auVar21._0_4_);
      if (!bVar11 || iVar9 != 0) {
        auVar4._8_4_ = 0x7fffffff;
        auVar4._0_8_ = 0x7fffffff7fffffff;
        auVar4._12_4_ = 0x7fffffff;
        auVar14 = vandps_avx512vl(auVar20,auVar4);
        bVar11 = iVar9 < 0;
        uVar1 = vcmpss_avx512f(auVar14,auVar15,1);
        bVar2 = (bool)((byte)uVar1 & 1);
        fVar12 = (float)((uint)(iVar10 == 0) * ((uint)bVar11 * iVar22 + (uint)!bVar11 * (int)fVar12)
                        + (uint)(iVar10 != 0) * (int)fVar12);
        auVar13._0_4_ =
             (uint)bVar2 * ((uint)bVar11 * iVar22 + (uint)!bVar11 * (int)logarithmic_zero_epsilon) +
             (uint)!bVar2 * (int)auVar20._0_4_;
        auVar13._4_12_ = auVar20._4_12_;
      }
      auVar15._0_4_ = (float)iVar8;
      auVar15._4_12_ = in_register_00001404;
      fVar16 = 0.0;
      fVar17 = auVar13._0_4_;
      if (fVar17 < auVar15._0_4_) {
        if (fVar12 <= auVar15._0_4_) {
          fVar16 = 1.0;
        }
        else if (v_max * v_min < 0) {
          auVar5._8_4_ = 0x80000000;
          auVar5._0_8_ = 0x8000000080000000;
          auVar5._12_4_ = 0x80000000;
          auVar14 = vxorps_avx512vl(auVar20,auVar5);
          fVar16 = auVar14._0_4_ / (auVar21._0_4_ - auVar20._0_4_);
          if (v != 0) {
            if (v < 0) {
              auVar6._8_4_ = 0x80000000;
              auVar6._0_8_ = 0x8000000080000000;
              auVar6._12_4_ = 0x80000000;
              auVar15 = vxorps_avx512vl(auVar15,auVar6);
              fVar12 = logf(auVar15._0_4_ / logarithmic_zero_epsilon);
              auVar7._8_4_ = 0x80000000;
              auVar7._0_8_ = 0x8000000080000000;
              auVar7._12_4_ = 0x80000000;
              auVar15 = vxorps_avx512vl(auVar13,auVar7);
              fVar17 = logf(auVar15._0_4_ / logarithmic_zero_epsilon);
              fVar16 = (1.0 - fVar12 / fVar17) * (fVar16 - zero_deadzone_halfsize);
            }
            else {
              fVar17 = logf(auVar15._0_4_ / logarithmic_zero_epsilon);
              fVar12 = logf(fVar12 / logarithmic_zero_epsilon);
              auVar19._0_4_ = fVar17 / fVar12;
              auVar19._4_12_ = SUB6012((undefined1  [60])0x0,0);
              auVar15 = vfmadd213ss_fma(ZEXT416((uint)(1.0 - (fVar16 + zero_deadzone_halfsize))),
                                        auVar19,ZEXT416((uint)(fVar16 + zero_deadzone_halfsize)));
              fVar16 = auVar15._0_4_;
            }
          }
        }
        else if ((v_max | v_min) < 0) {
          fVar16 = logf(auVar15._0_4_ / fVar12);
          fVar12 = logf(fVar17 / fVar12);
          fVar16 = 1.0 - fVar16 / fVar12;
        }
        else {
          fVar16 = logf(auVar15._0_4_ / fVar17);
          fVar12 = logf(fVar12 / fVar17);
          fVar16 = fVar16 / fVar12;
        }
      }
      fVar12 = (float)((uint)(v_max < v_min) * (int)(1.0 - fVar16) +
                      (uint)(v_max >= v_min) * (int)fVar16);
    }
    else {
      fVar12 = (float)(iVar8 - v_min) / (float)iVar9;
    }
  }
  return fVar12;
}

Assistant:

float ImGui::ScaleRatioFromValueT(ImGuiDataType data_type, TYPE v, TYPE v_min, TYPE v_max, bool is_logarithmic, float logarithmic_zero_epsilon, float zero_deadzone_halfsize)
{
    if (v_min == v_max)
        return 0.0f;
    IM_UNUSED(data_type);

    const TYPE v_clamped = (v_min < v_max) ? ImClamp(v, v_min, v_max) : ImClamp(v, v_max, v_min);
    if (is_logarithmic)
    {
        bool flipped = v_max < v_min;

        if (flipped) // Handle the case where the range is backwards
            ImSwap(v_min, v_max);

        // Fudge min/max to avoid getting close to log(0)
        FLOATTYPE v_min_fudged = (ImAbs((FLOATTYPE)v_min) < logarithmic_zero_epsilon) ? ((v_min < 0.0f) ? -logarithmic_zero_epsilon : logarithmic_zero_epsilon) : (FLOATTYPE)v_min;
        FLOATTYPE v_max_fudged = (ImAbs((FLOATTYPE)v_max) < logarithmic_zero_epsilon) ? ((v_max < 0.0f) ? -logarithmic_zero_epsilon : logarithmic_zero_epsilon) : (FLOATTYPE)v_max;

        // Awkward special cases - we need ranges of the form (-100 .. 0) to convert to (-100 .. -epsilon), not (-100 .. epsilon)
        if ((v_min == 0.0f) && (v_max < 0.0f))
            v_min_fudged = -logarithmic_zero_epsilon;
        else if ((v_max == 0.0f) && (v_min < 0.0f))
            v_max_fudged = -logarithmic_zero_epsilon;

        float result;

        if (v_clamped <= v_min_fudged)
            result = 0.0f; // Workaround for values that are in-range but below our fudge
        else if (v_clamped >= v_max_fudged)
            result = 1.0f; // Workaround for values that are in-range but above our fudge
        else if ((v_min * v_max) < 0.0f) // Range crosses zero, so split into two portions
        {
            float zero_point_center = (-(float)v_min) / ((float)v_max - (float)v_min); // The zero point in parametric space.  There's an argument we should take the logarithmic nature into account when calculating this, but for now this should do (and the most common case of a symmetrical range works fine)
            float zero_point_snap_L = zero_point_center - zero_deadzone_halfsize;
            float zero_point_snap_R = zero_point_center + zero_deadzone_halfsize;
            if (v == 0.0f)
                result = zero_point_center; // Special case for exactly zero
            else if (v < 0.0f)
                result = (1.0f - (float)(ImLog(-(FLOATTYPE)v_clamped / logarithmic_zero_epsilon) / ImLog(-v_min_fudged / logarithmic_zero_epsilon))) * zero_point_snap_L;
            else
                result = zero_point_snap_R + ((float)(ImLog((FLOATTYPE)v_clamped / logarithmic_zero_epsilon) / ImLog(v_max_fudged / logarithmic_zero_epsilon)) * (1.0f - zero_point_snap_R));
        }
        else if ((v_min < 0.0f) || (v_max < 0.0f)) // Entirely negative slider
            result = 1.0f - (float)(ImLog(-(FLOATTYPE)v_clamped / -v_max_fudged) / ImLog(-v_min_fudged / -v_max_fudged));
        else
            result = (float)(ImLog((FLOATTYPE)v_clamped / v_min_fudged) / ImLog(v_max_fudged / v_min_fudged));

        return flipped ? (1.0f - result) : result;
    }

    // Linear slider
    return (float)((FLOATTYPE)(SIGNEDTYPE)(v_clamped - v_min) / (FLOATTYPE)(SIGNEDTYPE)(v_max - v_min));
}